

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  undefined8 *puVar1;
  int iVar2;
  ImDrawChannel *pIVar3;
  void *pvVar4;
  ImDrawChannel *__dest;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  
  iVar2 = (this->_Channels).Size;
  if (iVar2 < channels_count) {
    if ((this->_Channels).Capacity < channels_count) {
      __dest = (ImDrawChannel *)ImGui::MemAlloc((long)channels_count << 5);
      pIVar3 = (this->_Channels).Data;
      if (pIVar3 != (ImDrawChannel *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = __dest;
      (this->_Channels).Capacity = channels_count;
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  pIVar3 = (this->_Channels).Data;
  (pIVar3->_IdxBuffer).Size = 0;
  (pIVar3->_IdxBuffer).Capacity = 0;
  (pIVar3->_IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar3->_CmdBuffer).Size = 0;
  (pIVar3->_CmdBuffer).Capacity = 0;
  (pIVar3->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar7 = 1;
    lVar6 = 0x38;
    do {
      pIVar3 = (this->_Channels).Data;
      puVar1 = (undefined8 *)((long)&(pIVar3->_CmdBuffer).Size + lVar6);
      if ((long)uVar7 < (long)iVar2) {
        if (*(int *)((long)pIVar3 + lVar6 + -0x14) < 0) {
          pvVar5 = ImGui::MemAlloc(0);
          pvVar4 = *(void **)((long)pIVar3 + lVar6 + -0x10);
          if (pvVar4 != (void *)0x0) {
            memcpy(pvVar5,pvVar4,(long)*(int *)((long)pIVar3 + lVar6 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar3 + lVar6 + -0x10));
          }
          *(void **)((long)pIVar3 + lVar6 + -0x10) = pvVar5;
          *(undefined4 *)((long)pIVar3 + lVar6 + -0x14) = 0;
        }
        *(undefined4 *)(puVar1 + -3) = 0;
        pIVar3 = (this->_Channels).Data;
        if (*(int *)((long)pIVar3 + lVar6 + -4) < 0) {
          pvVar5 = ImGui::MemAlloc(0);
          pvVar4 = *(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar6);
          if (pvVar4 != (void *)0x0) {
            memcpy(pvVar5,pvVar4,(long)*(int *)((long)pIVar3 + lVar6 + -8) * 2);
            ImGui::MemFree(*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar6));
          }
          *(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar6) = pvVar5;
          *(undefined4 *)((long)pIVar3 + lVar6 + -4) = 0;
        }
        *(undefined4 *)((long)pIVar3 + lVar6 + -8) = 0;
      }
      else {
        puVar1[-1] = 0;
        *puVar1 = 0;
        puVar1[-3] = 0;
        puVar1[-2] = 0;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x20;
    } while ((uint)channels_count != uVar7);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}